

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * google::protobuf::internal::
       WireFormatParser<google::protobuf::Message::_InternalParse(char_const*,google::protobuf::internal::ParseContext*)::ReflectiveFieldParser>
                 (ReflectiveFieldParser *field_parser,char *ptr,ParseContext *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint32 uVar5;
  uint64 uVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint64 *puVar10;
  Descriptor *pDVar11;
  MessageLite *this;
  LogMessage *other;
  Message *pMVar12;
  undefined4 extraout_var;
  FieldDescriptor *pFVar13;
  UnknownFieldSet *pUVar14;
  string *psVar15;
  uint num;
  ReflectiveFieldParser *pRVar16;
  uint32 uVar17;
  uint64 value_00;
  LogFinisher local_81;
  uint64 *local_80;
  string *local_78;
  uint32 tag;
  uint64 value;
  
  local_78 = &field_parser->payload_;
  local_80 = (uint64 *)ptr;
LAB_00272a92:
  bVar7 = ParseContext::Done(ctx,(char **)&local_80);
  if (bVar7) {
    return (char *)local_80;
  }
  puVar10 = (uint64 *)ReadTag((char *)local_80,&tag,0);
  uVar17 = tag;
  if (puVar10 == (uint64 *)0x0) {
    return (char *)0x0;
  }
  if ((tag == 0) || (uVar8 = tag & 7, uVar8 == 4)) {
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
    return (char *)puVar10;
  }
  if (tag < 8) {
    return (char *)0x0;
  }
  if (5 < uVar8) {
    return (char *)0x0;
  }
  num = tag >> 3;
  local_80 = puVar10;
  switch(uVar8) {
  case 0:
    puVar10 = (uint64 *)VarintParse<unsigned_long>((char *)puVar10,&value);
    value_00 = value;
    if (puVar10 == (uint64 *)0x0) {
      return (char *)0x0;
    }
    if ((num == 2) && (field_parser->is_item_ != false)) {
      uVar17 = (uint32)value;
      if ((field_parser->payload_)._M_string_length == 0) {
        field_parser->type_id_ = uVar17;
        local_80 = puVar10;
      }
      else {
        pFVar13 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,uVar17,2);
        if ((pFVar13 == (FieldDescriptor *)0x0) ||
           (pDVar11 = FieldDescriptor::message_type(pFVar13), pDVar11 == (Descriptor *)0x0)) {
          pUVar14 = Message::_InternalParse::ReflectiveFieldParser::MutableUnknown(field_parser);
          psVar15 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(pUVar14,uVar17);
          std::__cxx11::string::swap((string *)psVar15);
          local_80 = puVar10;
        }
        else {
          this = &Reflection::MutableMessage
                            (field_parser->reflection_,field_parser->msg_,pFVar13,
                             (MessageFactory *)0x0)->super_MessageLite;
          MessageLite::ParsePartialFromString(this,local_78);
          local_80 = puVar10;
        }
      }
      goto LAB_00272a92;
    }
    pFVar13 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,num,0);
    if (pFVar13 == (FieldDescriptor *)0x0) {
      pUVar14 = Message::_InternalParse::ReflectiveFieldParser::MutableUnknown(field_parser);
      UnknownFieldSet::AddVarint(pUVar14,num,value_00);
      local_80 = puVar10;
      goto LAB_00272a92;
    }
    break;
  case 1:
    value_00 = *puVar10;
    puVar10 = puVar10 + 1;
    pFVar13 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,num,1);
    if (pFVar13 == (FieldDescriptor *)0x0) {
      pUVar14 = Message::_InternalParse::ReflectiveFieldParser::MutableUnknown(field_parser);
      UnknownFieldSet::AddFixed64(pUVar14,num,value_00);
      local_80 = puVar10;
      goto LAB_00272a92;
    }
    break;
  case 2:
    if ((num == 3) && (field_parser->is_item_ != false)) {
      num = field_parser->type_id_;
      psVar15 = local_78;
      if (num != 0) {
        field_parser->type_id_ = 0;
        goto LAB_00272bf9;
      }
    }
    else {
LAB_00272bf9:
      pRVar16 = field_parser;
      pFVar13 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,num,2);
      if (pFVar13 != (FieldDescriptor *)0x0) {
        local_80 = (uint64 *)
                   ParseLenDelim((int)pRVar16,pFVar13,field_parser->msg_,field_parser->reflection_,
                                 (char *)puVar10,ctx);
        goto LAB_00272e03;
      }
      pUVar14 = Message::_InternalParse::ReflectiveFieldParser::MutableUnknown(field_parser);
      psVar15 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(pUVar14,num);
    }
    local_80 = (uint64 *)InlineGreedyStringParser(psVar15,(char *)puVar10,ctx);
    goto LAB_00272e03;
  case 3:
    if (((field_parser->is_item_ == false) && (num == 1)) &&
       (*(char *)(*(long *)(field_parser->descriptor_ + 0x20) + 0x48) != '\0')) {
      field_parser->is_item_ = true;
      iVar9 = ctx->depth_;
      ctx->depth_ = iVar9 + -1;
      if (iVar9 < 1) {
        local_80 = (uint64 *)0x0;
      }
      else {
        ctx->group_depth_ = ctx->group_depth_ + 1;
        local_80 = (uint64 *)
                   WireFormatParser<google::protobuf::Message::_InternalParse(char_const*,google::protobuf::internal::ParseContext*)::ReflectiveFieldParser>
                             (field_parser,(char *)puVar10,ctx);
        uVar2 = ctx->depth_;
        uVar4 = ctx->group_depth_;
        ctx->depth_ = uVar2 + 1;
        ctx->group_depth_ = uVar4 + -1;
        uVar17 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
        if (uVar17 != 0xb) {
          local_80 = (uint64 *)0x0;
        }
      }
      field_parser->is_item_ = false;
      field_parser->type_id_ = 0;
    }
    else {
      pRVar16 = field_parser;
      pFVar13 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,num,3);
      if (pFVar13 == (FieldDescriptor *)0x0) {
        pUVar14 = Message::_InternalParse::ReflectiveFieldParser::MutableUnknown(field_parser);
        local_80 = (uint64 *)
                   UnknownFieldParse((ulong)(uVar17 & 0xfffffff8) | 3,pUVar14,(char *)puVar10,ctx);
      }
      else {
        pMVar12 = GetGroup((int)pRVar16,pFVar13,field_parser->msg_,field_parser->reflection_);
        iVar9 = ctx->depth_;
        ctx->depth_ = iVar9 + -1;
        if (iVar9 < 1) {
          return (char *)0x0;
        }
        ctx->group_depth_ = ctx->group_depth_ + 1;
        iVar9 = (*(pMVar12->super_MessageLite)._vptr_MessageLite[0xd])(pMVar12,puVar10,ctx);
        local_80 = (uint64 *)CONCAT44(extraout_var,iVar9);
        uVar1 = ctx->depth_;
        uVar3 = ctx->group_depth_;
        ctx->depth_ = uVar1 + 1;
        ctx->group_depth_ = uVar3 + -1;
        uVar5 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
        if (uVar5 != (uVar17 & 0xfffffff8 | 3)) {
          return (char *)0x0;
        }
      }
    }
LAB_00272e03:
    if (local_80 == (uint64 *)0x0) {
      return (char *)0x0;
    }
    goto LAB_00272a92;
  case 4:
    LogMessage::LogMessage
              ((LogMessage *)&value,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/parse_context.h"
               ,0x2b7);
    other = LogMessage::operator<<((LogMessage *)&value,"Can\'t happen");
    LogFinisher::operator=(&local_81,other);
    LogMessage::~LogMessage((LogMessage *)&value);
    local_80 = puVar10;
    goto LAB_00272a92;
  case 5:
    uVar6 = *puVar10;
    value_00 = (uint64)(uint)uVar6;
    puVar10 = (uint64 *)((long)puVar10 + 4);
    pFVar13 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,num,5);
    if (pFVar13 == (FieldDescriptor *)0x0) {
      pUVar14 = Message::_InternalParse::ReflectiveFieldParser::MutableUnknown(field_parser);
      UnknownFieldSet::AddFixed32(pUVar14,num,(uint)uVar6);
      local_80 = puVar10;
      goto LAB_00272a92;
    }
  }
  SetField(value_00,pFVar13,field_parser->msg_,field_parser->reflection_);
  local_80 = puVar10;
  goto LAB_00272a92;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* WireFormatParser(T& field_parser,
                                                      const char* ptr,
                                                      ParseContext* ctx) {
  while (!ctx->Done(&ptr)) {
    uint32 tag;
    ptr = ReadTag(ptr, &tag);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
    if (tag == 0 || (tag & 7) == 4) {
      ctx->SetLastTag(tag);
      return ptr;
    }
    ptr = FieldParser(tag, field_parser, ptr, ctx);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
  }
  return ptr;
}